

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Ses_ManPrintFuncs(Ses_Man_t *pSes)

{
  long lVar1;
  bool bVar2;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong *puVar8;
  ulong *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  printf("find optimum circuit for %d %d-variable functions:\n",(ulong)(uint)pSes->nSpecFunc,
         (ulong)(uint)pSes->nSpecVars);
  if (0 < pSes->nSpecFunc) {
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      printf("  func %d: ");
      __stream = _stdout;
      iVar10 = pSes->nSpecVars;
      if (iVar10 < 2) {
        __assert_fail("nVars >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
      }
      puVar9 = pSes->pSpec + ((int)lVar7 << 2);
      iVar4 = 1 << ((char)iVar10 - 6U & 0x1f);
      if (iVar10 < 7) {
        iVar4 = 1;
      }
      puVar8 = puVar9 + (long)iVar4 + -1;
      if (puVar9 <= puVar8) {
        uVar3 = ~(-1 << ((char)iVar10 - 2U & 0x1f));
        if (5 < iVar10) {
          uVar3 = 0xf;
        }
        lVar7 = (ulong)uVar3 + 1;
        lVar12 = (ulong)uVar3 << 2;
        lVar5 = lVar7;
        lVar11 = lVar12;
        do {
          uVar3 = (uint)(*puVar8 >> ((byte)lVar11 & 0x3c)) & 0xf;
          iVar10 = uVar3 + 0x30;
          if (9 < uVar3) {
            iVar10 = uVar3 + 0x37;
          }
          fputc(iVar10,__stream);
          lVar6 = lVar5 + -1;
          bVar2 = 0 < lVar5;
          lVar5 = lVar6;
          lVar11 = lVar11 + -4;
        } while ((lVar6 != 0 && bVar2) ||
                (puVar8 = puVar8 + -1, lVar5 = lVar7, lVar11 = lVar12, puVar9 <= puVar8));
      }
      putchar(10);
      lVar7 = lVar1;
    } while (lVar1 < pSes->nSpecFunc);
  }
  if ((pSes->nMaxDepth != -1) && (printf("  max depth = %d\n"), pSes->pArrTimeProfile != (int *)0x0)
     ) {
    printf("  arrival times =");
    if (0 < pSes->nSpecVars) {
      lVar7 = 0;
      do {
        printf(" %d",(ulong)(uint)pSes->pArrTimeProfile[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < pSes->nSpecVars);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

static inline void Ses_ManPrintFuncs( Ses_Man_t * pSes )
{
    int h;

    printf( "find optimum circuit for %d %d-variable functions:\n", pSes->nSpecFunc, pSes->nSpecVars );
    for ( h = 0; h < pSes->nSpecFunc; ++h )
    {
        printf( "  func %d: ", h + 1 );
        Abc_TtPrintHexRev( stdout, &pSes->pSpec[h << 2], pSes->nSpecVars );
        printf( "\n" );
    }

    if ( pSes->nMaxDepth != -1 )
    {
        printf( "  max depth = %d\n", pSes->nMaxDepth );
        if ( pSes->pArrTimeProfile )
        {
            printf( "  arrival times =" );
            for ( h = 0; h < pSes->nSpecVars; ++h )
                printf( " %d", pSes->pArrTimeProfile[h] );
            printf( "\n" );
        }
    }
}